

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::SignalEventExpressionSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,SignalEventExpressionSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *node;
  size_t index_local;
  SignalEventExpressionSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->edge).kind;
    token._2_1_ = (this->edge).field_0x2;
    token.numFlags.raw = (this->edge).numFlags.raw;
    token.rawLen = (this->edge).rawLen;
    token.info = (this->edge).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->expr)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
  }
  else if (index == 2) {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->iffClause->super_SyntaxNode);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax SignalEventExpressionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return edge;
        case 1: return expr.get();
        case 2: return iffClause;
        default: return nullptr;
    }
}